

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_visuals.cxx
# Opt level: O2

void __thiscall xray_re::xr_visual_object::load(xr_visual_object *this,xr_reader *r)

{
  uint32_t *puVar1;
  uint __line;
  undefined8 in_RAX;
  size_t sVar2;
  char *__assertion;
  uint16_t version;
  
  version = (uint16_t)((ulong)in_RAX >> 0x30);
  sVar2 = xr_reader::r_chunk<unsigned_short>(r,0x900,&version);
  if (sVar2 == 0) {
    __assertion = "0";
    __line = 0x12;
  }
  else if ((version & 0xfffe) == 0x10) {
    if (version == 0x10) {
      sVar2 = xr_reader::find_chunk(r,0x904);
      if (sVar2 == 0) {
        __assertion = "0";
        __line = 0x17;
        goto LAB_0017ce47;
      }
      xr_reader::r_fvector3(r,&(this->super_xr_custom_object).m_position);
      xr_reader::r_fvector3(r,&(this->super_xr_custom_object).m_rotation);
      xr_reader::r_fvector3(r,&(this->super_xr_custom_object).m_scale);
    }
    xr_custom_object::load(&this->super_xr_custom_object,r);
    sVar2 = xr_reader::find_chunk(r,0x902);
    if (sVar2 != 0) {
      puVar1 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
      *(uint32_t *)&(this->super_xr_custom_object).field_0x6c = *puVar1;
      (r->field_2).m_p = (r->field_2).m_p + 4;
      xr_reader::r_sz(r,&this->m_reference);
      xr_reader::r_chunk<unsigned_int>(r,0x905,&this->m_flags);
      return;
    }
    __assertion = "0";
    __line = 0x21;
  }
  else {
    __assertion = "version == SCENEOBJ_VERSION_16 || version == SCENEOBJ_VERSION";
    __line = 0x13;
  }
LAB_0017ce47:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_visuals.cxx"
                ,__line,"virtual void xray_re::xr_visual_object::load(xr_reader &)");
}

Assistant:

void xr_visual_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(SCENEOBJ_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SCENEOBJ_VERSION_16 || version == SCENEOBJ_VERSION);

	if (version == SCENEOBJ_VERSION_16) {
		if (!r.find_chunk(SCENEOBJ_CHUNK_PLACEMENT))
			xr_not_expected();
		r.r_fvector3(co_position());
		r.r_fvector3(co_rotation());
		r.r_fvector3(co_scale());
		r.debug_find_chunk();
	}

	xr_custom_object::load(r);

	if (!r.find_chunk(SCENEOBJ_CHUNK_REFERENCE))
		xr_not_expected();
	m_file_version = r.r_u32();
	r.r_u32();
	r.r_sz(m_reference);
	r.debug_find_chunk();

	r.r_chunk<uint32_t>(SCENEOBJ_CHUNK_FLAGS, m_flags);
}